

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall mario::TimerQueue::addTimerInLoop(TimerQueue *this,Timer *timer)

{
  int timerfd;
  bool bVar1;
  Timestamp expiration;
  bool earliestChanged;
  Timer *timer_local;
  TimerQueue *this_local;
  
  EventLoop::assertInLoopThread(this->_loop);
  bVar1 = insert(this,timer);
  if (bVar1) {
    timerfd = this->_timerfd;
    expiration = Timer::expiration(timer);
    detail::resetTimerfd(timerfd,expiration);
  }
  return;
}

Assistant:

void TimerQueue::addTimerInLoop(Timer* timer) {
    _loop->assertInLoopThread();
    bool earliestChanged = insert(timer);
    if (earliestChanged) {
        resetTimerfd(_timerfd, timer->expiration());
    }
}